

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool CoreML::Specification::UpsampleLayerParams_LinearUpsampleMode_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 3;
}

Assistant:

bool UpsampleLayerParams_LinearUpsampleMode_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}